

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter(OPAtomIndexFooter *this,Dictionary *d)

{
  Dictionary *d_local;
  OPAtomIndexFooter *this_local;
  
  Partition::Partition(&this->super_Partition,d);
  (this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__OPAtomIndexFooter_00338fc8;
  Kumu::ByteString::ByteString(&this->m_FooterData);
  this->m_CurrentSegment = (IndexTableSegment *)0x0;
  this->m_BytesPerEditUnit = 0;
  Rational::Rational(&this->m_EditRate);
  this->m_BodySID = 0;
  IndexTableSegment::DeltaEntry::DeltaEntry(&this->m_DefaultDeltaEntry);
  this->m_ECOffset = 0;
  this->m_Lookup = (IPrimerLookup *)0x0;
  (this->super_Partition).BodySID = 0;
  (this->super_Partition).IndexSID = 0x81;
  return;
}

Assistant:

ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter(const Dictionary* d) :
  Partition(d),
  m_CurrentSegment(0), m_BytesPerEditUnit(0), m_BodySID(0),
  m_ECOffset(0), m_Lookup(0)
{
  BodySID = 0;
  IndexSID = 129;
}